

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Type *pTVar3;
  Descriptor *pDVar4;
  undefined4 extraout_var;
  LogMessage *other;
  undefined8 extraout_RAX;
  LogFinisher local_61;
  LogMessage local_60;
  long *plVar5;
  
  pEVar2 = MaybeNewRepeatedExtension(this,descriptor);
  pTVar3 = RepeatedPtrFieldBase::
           AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                     ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value);
  if (pTVar3 == (Type *)0x0) {
    if ((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_ == 0)
    {
      pDVar4 = FieldDescriptor::message_type(descriptor);
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,pDVar4);
      plVar5 = (long *)CONCAT44(extraout_var,iVar1);
      if (plVar5 == (long *)0x0) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x111);
        other = LogMessage::operator<<(&local_60,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
        LogMessage::~LogMessage(&local_60);
        _Unwind_Resume(extraout_RAX);
      }
    }
    else {
      plVar5 = (long *)((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_
                       )->elements[0];
    }
    pTVar3 = (Type *)(**(code **)(*plVar5 + 0x20))(plVar5,this->arena_);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar2->field_0).int64_value,pTVar3);
  }
  return pTVar3;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}